

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPolyhedron.cpp
# Opt level: O2

void __thiscall cbtConvexPolyhedron::initialize(cbtConvexPolyhedron *this)

{
  ulong uVar1;
  short sVar2;
  uint uVar3;
  int *piVar4;
  cbtVector3 *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  short tmp;
  cbtInternalEdge *pcVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 in_ZMM0 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar19;
  cbtInternalVertexPair vp;
  undefined1 local_e0 [16];
  cbtVector3 local_d0;
  cbtVector3 edge;
  cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge> edges;
  undefined1 auVar18 [56];
  
  lVar13 = 0;
  edges.m_hashTable.m_ownsMemory = true;
  edges.m_hashTable.m_data = (int *)0x0;
  edges.m_hashTable.m_size = 0;
  edges.m_hashTable.m_capacity = 0;
  edges.m_next.m_ownsMemory = true;
  edges.m_next.m_data = (int *)0x0;
  edges.m_next.m_size = 0;
  edges.m_next.m_capacity = 0;
  edges.m_valueArray.m_ownsMemory = true;
  edges.m_valueArray.m_data = (cbtInternalEdge *)0x0;
  edges.m_valueArray.m_size = 0;
  edges.m_valueArray.m_capacity = 0;
  edges.m_keyArray.m_ownsMemory = true;
  edges.m_keyArray.m_data = (cbtInternalVertexPair *)0x0;
  edges.m_keyArray.m_size = 0;
  edges.m_keyArray.m_capacity = 0;
  do {
    if ((this->m_faces).m_size <= lVar13) {
      initialize2(this);
      cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge>::~cbtHashMap(&edges);
      return;
    }
    uVar3 = (this->m_faces).m_data[lVar13].m_indices.m_size;
    uVar11 = 0;
    while (auVar18 = in_ZMM0._8_56_, uVar11 != (~((int)uVar3 >> 0x1f) & uVar3)) {
      uVar1 = uVar11 + 1;
      piVar4 = (this->m_faces).m_data[lVar13].m_indices.m_data;
      sVar2 = (short)piVar4[uVar11];
      vp.m_v1 = (short)piVar4[(long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff)
                              % (long)(int)uVar3 & 0xffffffff];
      vp.m_v0 = sVar2;
      if (sVar2 < vp.m_v1) {
        vp.m_v0 = vp.m_v1;
        vp.m_v1 = sVar2;
      }
      pcVar10 = cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge>::find(&edges,&vp);
      pcVar5 = (this->m_vertices).m_data;
      cVar19 = ::operator-(pcVar5 + vp.m_v1,pcVar5 + vp.m_v0);
      auVar15._0_8_ = cVar19.m_floats._0_8_;
      auVar15._8_56_ = auVar18;
      auVar6._8_8_ = in_XMM1_Qb;
      auVar6._0_8_ = cVar19.m_floats._8_8_;
      edge.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar15._0_16_,auVar6);
      in_ZMM0 = ZEXT1664((undefined1  [16])edge.m_floats);
      cbtVector3::normalize(&edge);
      lVar12 = -1;
      lVar14 = 0;
      do {
        auVar18 = in_ZMM0._8_56_;
        lVar12 = lVar12 + 1;
        if ((this->m_uniqueEdges).m_size <= lVar12) {
          cbtAlignedObjectArray<cbtVector3>::push_back(&this->m_uniqueEdges,&edge);
          break;
        }
        cVar19 = ::operator-((cbtVector3 *)((long)((this->m_uniqueEdges).m_data)->m_floats + lVar14)
                             ,&edge);
        auVar16._0_8_ = cVar19.m_floats._0_8_;
        auVar16._8_56_ = auVar18;
        auVar7._8_8_ = in_XMM1_Qb;
        auVar7._0_8_ = cVar19.m_floats._8_8_;
        local_e0 = vmovlhps_avx(auVar16._0_16_,auVar7);
        in_ZMM0 = ZEXT1664(local_e0);
        bVar9 = IsAlmostZero1((cbtVector3 *)local_e0);
        auVar18 = in_ZMM0._8_56_;
        if (bVar9) break;
        cVar19 = ::operator+((cbtVector3 *)((long)((this->m_uniqueEdges).m_data)->m_floats + lVar14)
                             ,&edge);
        auVar17._0_8_ = cVar19.m_floats._0_8_;
        auVar17._8_56_ = auVar18;
        auVar8._8_8_ = in_XMM1_Qb;
        auVar8._0_8_ = cVar19.m_floats._8_8_;
        local_d0.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar17._0_16_,auVar8);
        in_ZMM0 = ZEXT1664((undefined1  [16])local_d0.m_floats);
        bVar9 = IsAlmostZero1(&local_d0);
        lVar14 = lVar14 + 0x10;
      } while (!bVar9);
      uVar11 = uVar1;
      if (pcVar10 == (cbtInternalEdge *)0x0) {
        local_e0._0_4_ = 0xffff0000;
        local_e0._0_2_ = (short)lVar13;
        cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge>::insert
                  (&edges,&vp,(cbtInternalEdge *)local_e0);
      }
      else {
        pcVar10->m_face1 = (short)lVar13;
      }
    }
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

void cbtConvexPolyhedron::initialize()
{
	cbtHashMap<cbtInternalVertexPair, cbtInternalEdge> edges;

	for (int i = 0; i < m_faces.size(); i++)
	{
		int numVertices = m_faces[i].m_indices.size();
		int NbTris = numVertices;
		for (int j = 0; j < NbTris; j++)
		{
			int k = (j + 1) % numVertices;
			cbtInternalVertexPair vp(m_faces[i].m_indices[j], m_faces[i].m_indices[k]);
			cbtInternalEdge* edptr = edges.find(vp);
			cbtVector3 edge = m_vertices[vp.m_v1] - m_vertices[vp.m_v0];
			edge.normalize();

			bool found = false;

			for (int p = 0; p < m_uniqueEdges.size(); p++)
			{
				if (IsAlmostZero1(m_uniqueEdges[p] - edge) ||
					IsAlmostZero1(m_uniqueEdges[p] + edge))
				{
					found = true;
					break;
				}
			}

			if (!found)
			{
				m_uniqueEdges.push_back(edge);
			}

			if (edptr)
			{
				cbtAssert(edptr->m_face0 >= 0);
				cbtAssert(edptr->m_face1 < 0);
				edptr->m_face1 = i;
			}
			else
			{
				cbtInternalEdge ed;
				ed.m_face0 = i;
				edges.insert(vp, ed);
			}
		}
	}

#ifdef USE_CONNECTED_FACES
	for (int i = 0; i < m_faces.size(); i++)
	{
		int numVertices = m_faces[i].m_indices.size();
		m_faces[i].m_connectedFaces.resize(numVertices);

		for (int j = 0; j < numVertices; j++)
		{
			int k = (j + 1) % numVertices;
			cbtInternalVertexPair vp(m_faces[i].m_indices[j], m_faces[i].m_indices[k]);
			cbtInternalEdge* edptr = edges.find(vp);
			cbtAssert(edptr);
			cbtAssert(edptr->m_face0 >= 0);
			cbtAssert(edptr->m_face1 >= 0);

			int connectedFace = (edptr->m_face0 == i) ? edptr->m_face1 : edptr->m_face0;
			m_faces[i].m_connectedFaces[j] = connectedFace;
		}
	}
#endif  //USE_CONNECTED_FACES

	initialize2();
}